

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_priority_search.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::
priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
::search_nearest(priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
                 *this,node_type *node,scalar_type node_box_distance)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  scalar_type *psVar4;
  priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
  *in_RSI;
  priority_queue<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::vector<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>,_std::greater<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
  *in_RDI;
  float in_XMM0_Da;
  scalar_type sVar5;
  node_type *node_2nd;
  node_type *node_1st;
  scalar_type new_offset;
  scalar_type old_offset;
  scalar_type v;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  pointer *in_stack_ffffffffffffff78;
  float x;
  metric_l2_squared *in_stack_ffffffffffffff80;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff88
  ;
  kd_tree_node_topological<int,_float> **in_stack_ffffffffffffff90;
  pointer this_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  float local_44;
  float local_40;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffe0;
  scalar_type node_box_distance_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  node_box_distance_00 = (scalar_type)((ulong)in_stack_ffffffffffffffe0._M_current >> 0x20);
  bVar3 = kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>::is_leaf
                    ((kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>
                      *)in_RSI);
  if (bVar3) {
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (in_stack_ffffffffffffff88,(difference_type)in_stack_ffffffffffffff80);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (in_stack_ffffffffffffff88,(difference_type)in_stack_ffffffffffffff80);
    while (bVar3 = __gnu_cxx::operator<
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff78), bVar3) {
      this_00 = in_RDI[2].c.
                super__Vector_base<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
      in_stack_ffffffffffffff78 =
           &(in_RDI->c).
            super__Vector_base<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      in_stack_ffffffffffffff80 =
           (metric_l2_squared *)
           point_wrapper<pico_tree::internal::point<float,_784UL>_>::begin
                     ((point_wrapper<pico_tree::internal::point<float,_784UL>_> *)0x1153f2);
      psVar4 = point_wrapper<pico_tree::internal::point<float,_784UL>_>::end
                         ((point_wrapper<pico_tree::internal::point<float,_784UL>_> *)
                          in_stack_ffffffffffffff80);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
      space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>::operator[]<int>
                ((space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
                  *)in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      metric_l2_squared::operator()
                ((metric_l2_squared *)this_00,psVar4,(float *)in_stack_ffffffffffffff80,
                 (float *)in_stack_ffffffffffffff78);
      search_nn<pico_tree::neighbor<int,_float>_>::operator()
                ((search_nn<pico_tree::neighbor<int,_float>_> *)this_00,
                 (index_type)((ulong)psVar4 >> 0x20),SUB84(psVar4,0));
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
    }
  }
  else {
    psVar4 = point_wrapper<pico_tree::internal::point<float,_784UL>_>::operator[]
                       ((point_wrapper<pico_tree::internal::point<float,_784UL>_> *)
                        in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    fVar2 = *psVar4;
    x = (float)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (((*(float *)&(in_RSI->query_).point_ + *(float *)((long)&(in_RSI->query_).point_ + 4)) -
        fVar2) - fVar2 <= 0.0) {
      if (*(float *)&in_RSI->max_leaves_visited_ <= fVar2) {
        local_40 = metric_l2_squared::operator()(in_stack_ffffffffffffff80,x);
      }
      else {
        local_40 = 0.0;
      }
      local_44 = metric_l2_squared::operator()(in_stack_ffffffffffffff80,x);
    }
    else {
      pfVar1 = (float *)((long)&in_RSI->indices_ + 4);
      if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
        local_40 = metric_l2_squared::operator()(in_stack_ffffffffffffff80,x);
      }
      else {
        local_40 = 0.0;
      }
      local_44 = metric_l2_squared::operator()(in_stack_ffffffffffffff80,x);
    }
    search_nearest(in_RSI,(node_type *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                   node_box_distance_00);
    local_44 = (in_XMM0_Da - local_40) + local_44;
    sVar5 = search_nn<pico_tree::neighbor<int,_float>_>::max
                      ((search_nn<pico_tree::neighbor<int,_float>_> *)
                       in_RDI[2].c.
                       super__Vector_base<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (local_44 < sVar5) {
      ::std::
      priority_queue<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::vector<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::allocator<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>,std::greater<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>
      ::emplace<float&,pico_tree::internal::kd_tree_node_topological<int,float>const*&>
                (in_RDI,(float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff90);
    }
  }
  return;
}

Assistant:

inline void search_nearest(
      node_type const* const node, scalar_type node_box_distance) {
    if (node->is_leaf()) {
      auto begin = indices_.begin() + node->data.leaf.begin_idx;
      auto const end = indices_.begin() + node->data.leaf.end_idx;
      for (; begin < end; ++begin) {
        visitor_(*begin, metric_(query_.begin(), query_.end(), space_[*begin]));
      }
    } else {
      // Go left or right and then check if we should still go down the other
      // side based on the current minimum distance.
      scalar_type const v =
          query_[static_cast<size_t>(node->data.branch.split_dim)];
      scalar_type old_offset;
      scalar_type new_offset;
      node_type const* node_1st;
      node_type const* node_2nd;

      // On equals we would possibly need to go left as well. However, this is
      // handled by the if statement below this one: the check that max search
      // radius still hits the split value after having traversed the first
      // branch.
      // If left_max - v > 0, this means that the query is inside the left node,
      // if right_min - v < 0 it's inside the right one. For the area in between
      // we just pick the closest one by summing them.
      if ((node->data.branch.left_max + node->data.branch.right_min - v - v) >
          0) {
        node_1st = node->left;
        node_2nd = node->right;
        if (v > node->data.branch.left_min) {
          old_offset = scalar_type(0);
        } else {
          old_offset = metric_(node->data.branch.left_min - v);
        }
        new_offset = metric_(node->data.branch.right_min - v);
      } else {
        node_1st = node->right;
        node_2nd = node->left;
        if (v < node->data.branch.right_max) {
          old_offset = scalar_type(0);
        } else {
          old_offset = metric_(node->data.branch.right_max - v);
        }
        new_offset = metric_(node->data.branch.left_max - v);
      }

      // The distance and offset for node_1st is the same as that of its parent.
      search_nearest(node_1st, node_box_distance);

      // Calculate the distance to node_2nd.
      // NOTE: This method only works with Lp norms to which the exponent is not
      // applied.
      node_box_distance = node_box_distance - old_offset + new_offset;

      // Add to priority queue to be searched later.
      if (visitor_.max() > node_box_distance) {
        queue_.emplace(node_box_distance, node_2nd);
      }
    }
  }